

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_File_Input.cxx
# Opt level: O2

int __thiscall Fl_File_Input::handle_button(Fl_File_Input *this,int event)

{
  uint *puVar1;
  int iVar2;
  short sVar3;
  Fl_Window *this_00;
  char *pcVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  char newvalue [2048];
  
  pcVar4 = newvalue;
  iVar2 = (this->super_Fl_Input).super_Fl_Input_.xscroll_;
  iVar5 = 0;
  for (uVar7 = 0; this->buttons_[uVar7] != 0; uVar7 = uVar7 + 1) {
    iVar5 = iVar5 + this->buttons_[uVar7];
    iVar6 = iVar5 - iVar2;
    if ((iVar6 != 0 && iVar2 <= iVar5) &&
       (Fl::e_x < iVar6 + (this->super_Fl_Input).super_Fl_Input_.super_Fl_Widget.x_)) break;
  }
  sVar3 = -1;
  if (event != 2) {
    sVar3 = (short)uVar7;
  }
  this->pressed_ = sVar3;
  this_00 = Fl_Widget::window((Fl_Widget *)this);
  Fl_Window::make_current(this_00);
  draw_buttons(this);
  if ((event == 2) && (this->buttons_[uVar7] != 0)) {
    fl_strlcpy(newvalue,(this->super_Fl_Input).super_Fl_Input_.value_,0x800);
    for (; -1 < (int)uVar7; uVar7 = (ulong)((int)uVar7 - 1)) {
      pcVar4 = strchr(pcVar4,0x2f);
      if (pcVar4 == (char *)0x0) {
        return 1;
      }
      pcVar4 = pcVar4 + 1;
    }
    *pcVar4 = '\0';
    value(this,newvalue,(int)pcVar4 - (int)newvalue);
    puVar1 = &(this->super_Fl_Input).super_Fl_Input_.super_Fl_Widget.flags_;
    *(byte *)puVar1 = (byte)*puVar1 | 0x80;
    if (((this->super_Fl_Input).super_Fl_Input_.super_Fl_Widget.when_ & 5) != 0) {
      Fl_Widget::do_callback((Fl_Widget *)this);
    }
  }
  return 1;
}

Assistant:

int						// O - TRUE if we handled event
Fl_File_Input::handle_button(int event)		// I - Event
{
  int		i,				// Looping var
		X;				// Current X position
  char		*start,				// Start of path component
		*end;				// End of path component
  char		newvalue[FL_PATH_MAX];		// New value


  // Figure out which button is being pressed...
  for (X = 0, i = 0; buttons_[i]; i ++)
  {
    X += buttons_[i];

    if (X > xscroll() && Fl::event_x() < (x() + X - xscroll())) break;
  }

//  printf("handle_button(event = %d), button = %d\n", event, i);

  // Redraw the directory bar...
  if (event == FL_RELEASE) pressed_ = -1;
  else pressed_ = (short)i;

  window()->make_current();
  draw_buttons();

  // Return immediately if the user is clicking on the last button or
  // has not released the mouse button...
  if (!buttons_[i] || event != FL_RELEASE) return 1;

  // Figure out where to truncate the path...
  strlcpy(newvalue, value(), sizeof(newvalue));

  for (start = newvalue, end = start; start && i >= 0; start = end, i --) {
//    printf("    start = \"%s\"\n", start);
    if ((end = strchr(start, '/')) == NULL)
#if defined(WIN32) || defined(__EMX__)
      if ((end = strchr(start, '\\')) == NULL)
#endif // WIN32 || __EMX__
      break;

    end ++;
  }

  if (i < 0) {
    // Found the end; truncate the value and update the buttons...
    *start = '\0';
    value(newvalue, (int) (start - newvalue) );

    // Then do the callbacks, if necessary...
    set_changed();
    if (when() & (FL_WHEN_CHANGED|FL_WHEN_RELEASE) ) do_callback();
  }

  return 1;
}